

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O3

QString * __thiscall
QAccessibleTabButton::text(QString *__return_storage_ptr__,QAccessibleTabButton *this,Text t)

{
  Data *pDVar1;
  char16_t *pcVar2;
  char cVar3;
  QTypedArrayData<char16_t> *tmp;
  char16_t *tmp_1;
  long in_FS_OFFSET;
  QString local_70;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = (**(code **)(*(long *)this + 0x10))(this);
  if (cVar3 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_00516912;
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  switch(t) {
  case Name:
    QTabBar::accessibleTabName(&local_58,(QTabBar *)(this->m_parent).wp.value,this->m_index);
    pcVar2 = local_58.d.ptr;
    pDVar1 = local_58.d.d;
    (__return_storage_ptr__->d).d = local_58.d.d;
    local_58.d.d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = local_58.d.ptr;
    local_58.d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_58.d.size;
    if (local_58.d.size == 0) {
      QTabBar::tabText(&local_70,(QTabBar *)(this->m_parent).wp.value,this->m_index);
      qt_accStripAmp(&local_58,&local_70);
      (__return_storage_ptr__->d).d = local_58.d.d;
      (__return_storage_ptr__->d).ptr = local_58.d.ptr;
      (__return_storage_ptr__->d).size = local_58.d.size;
      local_58.d.size = 0;
      local_58.d.d = pDVar1;
      local_58.d.ptr = pcVar2;
      if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
        }
      }
      goto LAB_005168d2;
    }
    break;
  case Description:
    QTabBar::tabToolTip(&local_58,(QTabBar *)(this->m_parent).wp.value,this->m_index);
    goto LAB_00516876;
  case Help:
    QTabBar::tabWhatsThis(&local_58,(QTabBar *)(this->m_parent).wp.value,this->m_index);
LAB_00516876:
    (__return_storage_ptr__->d).d = local_58.d.d;
    (__return_storage_ptr__->d).ptr = local_58.d.ptr;
    (__return_storage_ptr__->d).size = local_58.d.size;
    break;
  case Accelerator:
    QTabBar::tabText(&local_70,(QTabBar *)(this->m_parent).wp.value,this->m_index);
    qt_accHotKey(&local_58,&local_70);
    pDVar1 = local_58.d.d;
    local_58.d.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = local_58.d.ptr;
    local_58.d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_58.d.size;
    local_58.d.size = 0;
LAB_005168d2:
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00516912:
  __stack_chk_fail();
}

Assistant:

QString text(QAccessible::Text t) const override
    {
        if (!isValid())
            return QString();
        QString str;
        switch (t) {
        case QAccessible::Name:
            str = m_parent->accessibleTabName(m_index);
            if (str.isEmpty())
                str = qt_accStripAmp(m_parent->tabText(m_index));
            break;
        case QAccessible::Accelerator:
            str = qt_accHotKey(m_parent->tabText(m_index));
            break;
#if QT_CONFIG(tooltip)
        case QAccessible::Description:
            str = m_parent->tabToolTip(m_index);
            break;
#endif
#if QT_CONFIG(whatsthis)
        case QAccessible::Help:
            str = m_parent->tabWhatsThis(m_index);
            break;
#endif
        default:
            break;
        }
        return str;
    }